

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O2

int run_with_options(Options *options)

{
  string *this;
  pointer pbVar1;
  Options *options_00;
  pointer pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  unsigned_long *puVar6;
  LexData *data;
  pointer pLVar7;
  LexData *data_1;
  pointer pLVar8;
  LexData *pLVar9;
  ParserData *pPVar10;
  ulong uVar11;
  pointer pbVar12;
  uint uVar13;
  _Any_data local_468;
  code *local_458;
  code *pcStack_450;
  Options *local_448;
  duration local_440;
  Program prog;
  thread_pool pool;
  KeywordStats keyword_stats;
  
  printf("running command \"%s\"\n",(options->command)._M_dataplus._M_p);
  local_440.__r = std::chrono::_V2::system_clock::now();
  thread_pool::thread_pool(&pool,(long)options->threads);
  prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  prog.parser_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  prog.parser_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  prog.parser_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  prog.lex_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  prog.parser_mutex.super___mutex_base._M_mutex.__align = 0;
  prog.lex_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  prog.lex_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  prog.lex_mutex.super___mutex_base._M_mutex.__align = 0;
  prog.lex_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  pbVar1 = (options->parse_files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = (string *)(keyword_stats.keywords._M_elems + 1);
  local_448 = options;
  for (pbVar12 = (options->parse_files).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar1; pbVar12 = pbVar12 + 1
      ) {
    keyword_stats.keywords._M_elems[0] = (unsigned_long)&pool;
    std::__cxx11::string::string(this,(string *)pbVar12);
    keyword_stats.keywords._M_elems[5] = (unsigned_long)&prog;
    local_468._M_unused._M_object = (void *)0x0;
    local_468._8_8_ = 0;
    local_458 = (code *)0x0;
    pcStack_450 = (code *)0x0;
    puVar6 = (unsigned_long *)operator_new(0x30);
    *puVar6 = keyword_stats.keywords._M_elems[0];
    std::__cxx11::string::string((string *)(puVar6 + 1),this);
    puVar6[5] = keyword_stats.keywords._M_elems[5];
    pcStack_450 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/cppillr.cpp:379:7)>
                  ::_M_invoke;
    local_458 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]cppillr/cppillr/cppillr.cpp:379:7)>
                ::_M_manager;
    local_468._M_unused._M_object = puVar6;
    thread_pool::execute(&pool,(function<void_()> *)&local_468);
    std::_Function_base::~_Function_base((_Function_base *)&local_468);
    std::__cxx11::string::~string(this);
  }
  thread_pool::wait_all(&pool);
  options_00 = local_448;
  if (local_448->show_time == true) {
    Stopwatch::watch((Stopwatch *)&local_440,"parse files");
  }
  bVar3 = std::operator==(&options_00->command,"docs");
  if (bVar3) {
    docs::run(options_00,&pool,&prog);
  }
  else {
    bVar3 = std::operator==(&options_00->command,"run");
    if (bVar3) {
      iVar4 = run::run(options_00,&pool,&prog);
      goto LAB_001043ed;
    }
  }
  iVar4 = 0;
LAB_001043ed:
  if (options_00->count_tokens == true) {
    uVar11 = 0;
    for (pLVar7 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar7 != prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                  super__Vector_impl_data._M_finish; pLVar7 = pLVar7 + 1) {
      uVar11 = (ulong)(uint)((int)uVar11 +
                            (int)(((long)(pLVar7->tokens).
                                         super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(pLVar7->tokens).
                                        super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                        super__Vector_impl_data._M_start) / 0x14));
    }
    printf("total tokens %d\n",uVar11);
  }
  pLVar7 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (options_00->count_lines == true) {
    uVar13 = 0;
    for (pLVar8 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                  super__Vector_impl_data._M_start; pLVar8 != pLVar7; pLVar8 = pLVar8 + 1) {
      iVar5 = count_lines(pLVar8);
      uVar13 = uVar13 + iVar5;
    }
    printf("total lines %d\n",(ulong)uVar13);
  }
  if (options_00->keyword_stats == true) {
    KeywordStats::KeywordStats(&keyword_stats);
    pLVar7 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pLVar8 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                  super__Vector_impl_data._M_start; pLVar8 != pLVar7; pLVar8 = pLVar8 + 1) {
      KeywordStats::add(&keyword_stats,pLVar8);
    }
    KeywordStats::print(&keyword_stats);
  }
  pLVar7 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar9 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (options_00->show_tokens == true) {
    for (; pLVar9 != pLVar7; pLVar9 = pLVar9 + 1) {
      show_tokens(pLVar9);
    }
  }
  pPVar2 = prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar10 = prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (options_00->show_ast == true) {
    for (; pPVar10 != pPVar2; pPVar10 = pPVar10 + 1) {
      show_ast(pPVar10);
    }
  }
  pLVar7 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar9 = prog.lex_data.super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (options_00->show_includes == true) {
    for (; pLVar9 != pLVar7; pLVar9 = pLVar9 + 1) {
      show_includes(pLVar9);
    }
  }
  pPVar2 = prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar10 = prog.parser_data.super__Vector_base<ParserData,_std::allocator<ParserData>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (options_00->show_functions == true) {
    for (; pPVar10 != pPVar2; pPVar10 = pPVar10 + 1) {
      show_functions(pPVar10,options_00->show_tokens);
    }
  }
  Program::~Program(&prog);
  thread_pool::~thread_pool(&pool);
  return iVar4;
}

Assistant:

int run_with_options(const Options& options)
{
  std::printf("running command \"%s\"\n", options.command.c_str());
  int ret_value = 0;

  Stopwatch t;
  thread_pool pool(options.threads);
  Program prog;

  for (const auto& fn : options.parse_files) {
    pool.execute(
      [&pool, fn, &prog]{
        Lexer lexer;
        lexer.lex(fn);

        int i = prog.add_lex(lexer.move_data());

        pool.execute(
          [i, &prog]{
            LexData data;
            prog.get_lex(i, data);

            Parser parser(i);
            parser.parse(data);

            prog.add_parser_data(parser.move_data());
          });
      });
  }
  pool.wait_all();

  if (options.show_time)
    t.watch("parse files");

  if (options.command == "docs")
    docs::run(options, pool, prog);
  else if (options.command == "run")
    ret_value = run::run(options, pool, prog);

  if (options.count_tokens) {
    int total_tokens = 0;
    for (auto& data : prog.lex_data)
      total_tokens += data.tokens.size();

    std::printf("total tokens %d\n", total_tokens);
  }

  if (options.count_lines) {
    int total_lines = 0;
    for (auto& data : prog.lex_data)
      total_lines += count_lines(data);

    std::printf("total lines %d\n", total_lines);
  }

  if (options.keyword_stats) {
    KeywordStats keyword_stats;
    for (auto& data : prog.lex_data)
      keyword_stats.add(data);

    keyword_stats.print();
  }

  if (options.show_tokens) {
    for (auto& data : prog.lex_data)
      show_tokens(data);
  }

  if (options.show_ast) {
    for (auto& data : prog.parser_data)
      show_ast(data);
  }

  if (options.show_includes) {
    for (auto& data : prog.lex_data)
      show_includes(data);
  }

  if (options.show_functions) {
    for (const auto& data : prog.parser_data)
      show_functions(data, options.show_tokens);
  }

  return ret_value;
}